

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

HSQUIRRELVM sq_open(SQInteger initialstacksize)

{
  bool bVar1;
  SQVM *x;
  SQObjectPtr *in_RDI;
  SQVM *v;
  SQSharedState *ss;
  SQSharedState *in_stack_00000028;
  SQVM *in_stack_00000030;
  SQSharedState *in_stack_00000060;
  SQInteger in_stack_00000080;
  SQVM *in_stack_00000088;
  SQVM *in_stack_00000090;
  SQSharedState *in_stack_000006e0;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  HSQUIRRELVM local_8;
  
  x = (SQVM *)sq_vm_malloc(0x109993);
  SQSharedState::SQSharedState(in_stack_00000060);
  SQSharedState::Init(in_stack_000006e0);
  local_8 = (HSQUIRRELVM)sq_vm_malloc(0x1099b6);
  SQVM::SQVM(in_stack_00000030,in_stack_00000028);
  SQObjectPtr::operator=(in_RDI,x);
  bVar1 = SQVM::Init(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  if (!bVar1) {
    (**(local_8->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)();
    sq_vm_free(local_8,in_stack_ffffffffffffffd8);
    local_8 = (HSQUIRRELVM)0x0;
  }
  return local_8;
}

Assistant:

HSQUIRRELVM sq_open(SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    sq_new(ss, SQSharedState);
    ss->Init();
    v = (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);
    ss->_root_vm = v;
    if(v->Init(NULL, initialstacksize)) {
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
    return v;
}